

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ct_binary_expr.hpp
# Opt level: O3

ostream * viennamath::operator<<
                    (ostream *stream,
                    ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<5L>,_viennamath::op_div<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_plus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_constant<5L>_>,_viennamath::op_div<double>,_viennamath::ct_constant<7L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_div<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<2UL>,_viennamath::op_plus<double>,_viennamath::ct_constant<7L>_>_>,_viennamath::op_plus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_constant<5L>_>_>_>_>
                    *other)

{
  ostream *poVar1;
  ct_binary_expr<viennamath::ct_constant<5L>,_viennamath::op_div<double>,_viennamath::ct_variable<0UL>_>
  local_3a;
  char *local_38;
  undefined8 local_30;
  undefined2 local_28;
  undefined6 uStack_26;
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_constant<5L>_>,_viennamath::op_div<double>,_viennamath::ct_constant<7L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_div<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<2UL>,_viennamath::op_plus<double>,_viennamath::ct_constant<7L>_>_>,_viennamath::op_plus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_constant<5L>_>_>_>
  local_18;
  
  std::__ostream_insert<char,std::char_traits<char>>(stream,"[",1);
  poVar1 = operator<<(stream,&local_3a);
  local_28 = 0x2b;
  local_30 = 1;
  local_38 = (char *)&local_28;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_28,1);
  poVar1 = operator<<(poVar1,&local_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
  if (local_38 != (char *)&local_28) {
    operator_delete(local_38,CONCAT62(uStack_26,local_28) + 1);
  }
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream & stream, ct_binary_expr<LHS, OP, RHS> const & other)
  {
    stream << "[" << other.lhs() << OP().str() << other.rhs() << "]";
    return stream;
  }